

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall docopt::BranchPattern::fix_repeating_arguments(BranchPattern *this)

{
  bool bVar1;
  int iVar2;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type pos;
  element_type *peVar3;
  LeafPattern *this_01;
  value *pvVar4;
  BranchPattern *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newValue;
  Option *o;
  bool ensureInt;
  bool ensureList;
  LeafPattern *leaf;
  shared_ptr<docopt::Pattern> *e;
  iterator __end2;
  iterator __begin2;
  unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *__range2;
  unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  group_set;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *group;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  *__range1;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  either;
  value *in_stack_fffffffffffffdf8;
  LeafPattern *in_stack_fffffffffffffe00;
  LeafPattern *in_stack_fffffffffffffe08;
  LeafPattern *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  Option *in_stack_fffffffffffffe20;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  in_stack_fffffffffffffe28;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  in_stack_fffffffffffffe30;
  allocator_type *in_stack_fffffffffffffe40;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_fffffffffffffe48;
  LeafPattern *pLVar5;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_fffffffffffffe50;
  LeafPattern *pLVar6;
  value *str;
  bool local_e1;
  _Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true> local_d0;
  _Node_iterator_base<std::shared_ptr<docopt::Pattern>,_true> local_c8;
  undefined1 *local_c0;
  undefined1 local_b3 [19];
  undefined1 local_a0 [56];
  reference local_68;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_60;
  __normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
  local_58;
  undefined1 *local_50;
  undefined1 local_20 [32];
  
  children(in_RDI);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  transform((PatternList *)leaf);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)in_stack_fffffffffffffe10);
  local_50 = local_20;
  local_58._M_current =
       (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        *)std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
          ::begin((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                   *)in_stack_fffffffffffffdf8);
  local_60 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              *)std::
                vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                ::end((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                       *)in_stack_fffffffffffffdf8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
                             *)in_stack_fffffffffffffe00,
                            (__normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
                             *)in_stack_fffffffffffffdf8), bVar1) {
    local_68 = __gnu_cxx::
               __normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
               ::operator*(&local_58);
    local_b3._11_8_ =
         std::
         vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ::begin((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)in_stack_fffffffffffffdf8);
    local_b3._3_8_ =
         std::
         vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ::end((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffdf8 = (value *)local_b3;
    std::allocator<std::shared_ptr<docopt::Pattern>_>::allocator
              ((allocator<std::shared_ptr<docopt::Pattern>_> *)0x1ff4db);
    str = in_stack_fffffffffffffdf8;
    std::
    unordered_multiset<std::shared_ptr<docopt::Pattern>,docopt::PatternHasher,std::equal_to<std::shared_ptr<docopt::Pattern>>,std::allocator<std::shared_ptr<docopt::Pattern>>>
    ::
    unordered_multiset<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
              ((unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (size_type)in_stack_fffffffffffffe18,(hasher *)in_stack_fffffffffffffe10,
               (key_equal *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe40);
    std::allocator<std::shared_ptr<docopt::Pattern>_>::~allocator
              ((allocator<std::shared_ptr<docopt::Pattern>_> *)0x1ff526);
    local_c0 = local_a0;
    local_c8._M_cur =
         (__node_type *)
         std::
         unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ::begin((unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)in_stack_fffffffffffffdf8);
    local_d0._M_cur =
         (__node_type *)
         std::
         unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ::end((unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)in_stack_fffffffffffffdf8);
    while (bVar1 = std::__detail::operator!=(&local_c8,&local_d0), bVar1) {
      this_00 = &std::__detail::_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true>::
                 operator*((_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true> *)0x1ff58b)
                 ->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>;
      pos = std::
            unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::count((unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8);
      if (pos != 1) {
        peVar3 = std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
        if (peVar3 == (element_type *)0x0) {
          this_01 = (LeafPattern *)0x0;
        }
        else {
          this_01 = (LeafPattern *)
                    __dynamic_cast(peVar3,&Pattern::typeinfo,&LeafPattern::typeinfo,0);
        }
        if (this_01 != (LeafPattern *)0x0) {
          local_e1 = false;
          bVar1 = false;
          pLVar5 = this_01;
          pLVar6 = this_01;
          if (this_01 == (LeafPattern *)0x0) {
            in_stack_fffffffffffffe40 = (allocator_type *)0x0;
          }
          else {
            in_stack_fffffffffffffe40 =
                 (allocator_type *)
                 __dynamic_cast(this_01,&LeafPattern::typeinfo,&Command::typeinfo,0);
          }
          if (in_stack_fffffffffffffe40 == (allocator_type *)0x0) {
            if (this_01 == (LeafPattern *)0x0) {
              in_stack_fffffffffffffe30._M_current = (shared_ptr<docopt::Pattern> *)0x0;
            }
            else {
              in_stack_fffffffffffffe30._M_current =
                   (shared_ptr<docopt::Pattern> *)
                   __dynamic_cast(this_01,&LeafPattern::typeinfo,&Argument::typeinfo,0);
            }
            if (in_stack_fffffffffffffe30._M_current == (shared_ptr<docopt::Pattern> *)0x0) {
              in_stack_fffffffffffffe28._M_current = (shared_ptr<docopt::Pattern> *)this_01;
              if (this_01 == (LeafPattern *)0x0) {
                in_stack_fffffffffffffe20 = (Option *)0x0;
              }
              else {
                in_stack_fffffffffffffe20 =
                     (Option *)__dynamic_cast(this_01,&LeafPattern::typeinfo,&Option::typeinfo,0);
              }
              if (in_stack_fffffffffffffe20 != (Option *)0x0) {
                iVar2 = Option::argCount(in_stack_fffffffffffffe20);
                bVar1 = iVar2 == 0;
                local_e1 = !bVar1;
              }
            }
            else {
              local_e1 = true;
            }
          }
          else {
            bVar1 = true;
          }
          if (local_e1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1ff7dc);
            pvVar4 = LeafPattern::getValue(this_01);
            bVar1 = value::isString(pvVar4);
            if (bVar1) {
              LeafPattern::getValue(this_01);
              in_stack_fffffffffffffe18 =
                   value::asString_abi_cxx11_((value *)in_stack_fffffffffffffe00);
              anon_unknown.dwarf_4808c::split((string *)str,pos);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffe10,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffe08);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffe10);
            }
            pvVar4 = LeafPattern::getValue(this_01);
            bVar1 = value::isStringList(pvVar4);
            if (!bVar1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pLVar6,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pLVar5);
              value::value((value *)this_01,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffe08);
              LeafPattern::setValue(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
              value::~value((value *)in_stack_fffffffffffffe00);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_01);
              in_stack_fffffffffffffe10 = this_01;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe10);
          }
          else if (bVar1) {
            value::value((value *)in_stack_fffffffffffffe00,
                         (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
            LeafPattern::setValue(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            value::~value((value *)in_stack_fffffffffffffe00);
            in_stack_fffffffffffffe08 = this_01;
          }
        }
      }
      std::__detail::_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true>::operator++
                ((_Node_iterator<std::shared_ptr<docopt::Pattern>,_true,_true> *)
                 in_stack_fffffffffffffe00);
    }
    std::
    unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ::~unordered_multiset
              ((unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)0x1ff999);
    __gnu_cxx::
    __normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
    ::operator++(&local_58);
  }
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ::~vector((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

inline void BranchPattern::fix_repeating_arguments()
	{
		std::vector<PatternList> either = transform(children());
		for(auto const& group : either) {
			// use multiset to help identify duplicate entries
			std::unordered_multiset<std::shared_ptr<Pattern>, PatternHasher> group_set {group.begin(), group.end()};
			for(auto const& e : group_set) {
				if (group_set.count(e) == 1)
					continue;

				LeafPattern* leaf = dynamic_cast<LeafPattern*>(e.get());
				if (!leaf) continue;

				bool ensureList = false;
				bool ensureInt = false;

				if (dynamic_cast<Command*>(leaf)) {
					ensureInt = true;
				} else if (dynamic_cast<Argument*>(leaf)) {
					ensureList = true;
				} else if (Option* o = dynamic_cast<Option*>(leaf)) {
					if (o->argCount()) {
						ensureList = true;
					} else {
						ensureInt = true;
					}
				}

				if (ensureList) {
					std::vector<std::string> newValue;
					if (leaf->getValue().isString()) {
						newValue = split(leaf->getValue().asString());
					}
					if (!leaf->getValue().isStringList()) {
						leaf->setValue(value{newValue});
					}
				} else if (ensureInt) {
					leaf->setValue(value{0});
				}
			}
		}
	}